

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O2

char * old_create_filter_action_spec(CMFormatList format_list,char *function)

{
  undefined8 *puVar1;
  FMFieldList list;
  int iVar2;
  CMFormatList pCVar3;
  FMStructDescList format_list_00;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  uVar6 = 0x20;
  lVar7 = 0;
  for (pCVar3 = format_list;
      (format_list != (CMFormatList)0x0 && (pCVar3->format_name != (char *)0x0));
      pCVar3 = pCVar3 + 1) {
    lVar7 = lVar7 + 1;
    uVar6 = uVar6 + 0x20;
  }
  pcVar4 = function;
  format_list_00 = (FMStructDescList)INT_CMmalloc(uVar6 & 0x1fffffffe0);
  lVar5 = 8;
  while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
    *(undefined8 *)((long)format_list_00 + lVar5 * 2 + -0x10) =
         *(undefined8 *)((long)format_list + lVar5 + -8);
    list = *(FMFieldList *)((long)&format_list->format_name + lVar5);
    *(FMFieldList *)((long)format_list_00 + lVar5 * 2 + -8) = list;
    iVar2 = struct_size_field_list(list,(int)pcVar4);
    *(int *)((long)&format_list_00->format_name + lVar5 * 2) = iVar2;
    *(undefined8 *)((long)&format_list_00->field_list + lVar5 * 2) = 0;
    lVar5 = lVar5 + 0x10;
  }
  puVar1 = (undefined8 *)((long)&format_list_00[-1].format_name + uVar6);
  *puVar1 = 0;
  puVar1[1] = 0;
  pcVar4 = create_filter_action_spec(format_list_00,function);
  return pcVar4;
}

Assistant:

extern char *
old_create_filter_action_spec(CMFormatList format_list, char *function)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return create_filter_action_spec(structs, function);
}